

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawListSplitter::Split(ImDrawListSplitter *this,ImDrawList *draw_list,int channels_count)

{
  undefined8 *puVar1;
  int iVar2;
  ImDrawChannel *pIVar3;
  void *pvVar4;
  int iVar5;
  ImDrawChannel *__dest;
  long lVar6;
  void *pvVar7;
  long lVar8;
  ulong uVar9;
  
  if ((this->_Current != 0) || (1 < this->_Count)) {
    __assert_fail("_Current == 0 && _Count <= 1 && \"Nested channel splitting is not supported. Please use separate instances of ImDrawListSplitter.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui_draw.cpp"
                  ,0x69d,"void ImDrawListSplitter::Split(ImDrawList *, int)");
  }
  iVar2 = (this->_Channels).Size;
  iVar5 = iVar2;
  if (iVar2 < channels_count) {
    if ((this->_Channels).Capacity < channels_count) {
      __dest = (ImDrawChannel *)ImGui::MemAlloc((long)channels_count << 5);
      pIVar3 = (this->_Channels).Data;
      if (pIVar3 != (ImDrawChannel *)0x0) {
        memcpy(__dest,pIVar3,(long)(this->_Channels).Size << 5);
        ImGui::MemFree((this->_Channels).Data);
      }
      (this->_Channels).Data = __dest;
      (this->_Channels).Capacity = channels_count;
    }
    (this->_Channels).Size = channels_count;
    iVar5 = channels_count;
  }
  this->_Count = channels_count;
  if (0 < iVar5) {
    pIVar3 = (this->_Channels).Data;
    (pIVar3->_IdxBuffer).Size = 0;
    (pIVar3->_IdxBuffer).Capacity = 0;
    (pIVar3->_IdxBuffer).Data = (unsigned_short *)0x0;
    (pIVar3->_CmdBuffer).Size = 0;
    (pIVar3->_CmdBuffer).Capacity = 0;
    (pIVar3->_CmdBuffer).Data = (ImDrawCmd *)0x0;
    if (1 < channels_count) {
      uVar9 = 1;
      lVar8 = 0x38;
      do {
        lVar6 = (long)(this->_Channels).Size;
        if ((long)uVar9 < (long)iVar2) {
          if (lVar6 <= (long)uVar9) goto LAB_00167ce4;
          pIVar3 = (this->_Channels).Data;
          if (*(int *)((long)pIVar3 + lVar8 + -0x14) < 0) {
            pvVar7 = ImGui::MemAlloc(0);
            pvVar4 = *(void **)((long)pIVar3 + lVar8 + -0x10);
            if (pvVar4 != (void *)0x0) {
              memcpy(pvVar7,pvVar4,(long)*(int *)((long)pIVar3 + lVar8 + -0x18) * 0x38);
              ImGui::MemFree(*(void **)((long)pIVar3 + lVar8 + -0x10));
            }
            *(void **)((long)pIVar3 + lVar8 + -0x10) = pvVar7;
            *(undefined4 *)((long)pIVar3 + lVar8 + -0x14) = 0;
          }
          *(undefined4 *)((long)pIVar3 + lVar8 + -0x18) = 0;
          if ((long)(this->_Channels).Size <= (long)uVar9) goto LAB_00167ce4;
          pIVar3 = (this->_Channels).Data;
          if (*(int *)((long)pIVar3 + lVar8 + -4) < 0) {
            pvVar7 = ImGui::MemAlloc(0);
            pvVar4 = *(void **)((long)&(pIVar3->_CmdBuffer).Size + lVar8);
            if (pvVar4 != (void *)0x0) {
              memcpy(pvVar7,pvVar4,(long)*(int *)((long)pIVar3 + lVar8 + -8) * 2);
              ImGui::MemFree(*(void **)((long)&(pIVar3->_CmdBuffer).Size + lVar8));
            }
            *(void **)((long)&(pIVar3->_CmdBuffer).Size + lVar8) = pvVar7;
            *(undefined4 *)((long)pIVar3 + lVar8 + -4) = 0;
          }
          *(undefined4 *)((long)pIVar3 + lVar8 + -8) = 0;
        }
        else {
          if (lVar6 <= (long)uVar9) goto LAB_00167ce4;
          pIVar3 = (this->_Channels).Data;
          puVar1 = (undefined8 *)((long)pIVar3 + lVar8 + -8);
          *puVar1 = 0;
          puVar1[1] = 0;
          puVar1 = (undefined8 *)((long)pIVar3 + lVar8 + -0x18);
          *puVar1 = 0;
          puVar1[1] = 0;
        }
        uVar9 = uVar9 + 1;
        lVar8 = lVar8 + 0x20;
      } while ((uint)channels_count != uVar9);
    }
    return;
  }
LAB_00167ce4:
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.h"
                ,0x703,"T &ImVector<ImDrawChannel>::operator[](int) [T = ImDrawChannel]");
}

Assistant:

void ImDrawListSplitter::Split(ImDrawList* draw_list, int channels_count)
{
    IM_UNUSED(draw_list);
    IM_ASSERT(_Current == 0 && _Count <= 1 && "Nested channel splitting is not supported. Please use separate instances of ImDrawListSplitter.");
    int old_channels_count = _Channels.Size;
    if (old_channels_count < channels_count)
    {
        _Channels.reserve(channels_count); // Avoid over reserving since this is likely to stay stable
        _Channels.resize(channels_count);
    }
    _Count = channels_count;

    // Channels[] (24/32 bytes each) hold storage that we'll swap with draw_list->_CmdBuffer/_IdxBuffer
    // The content of Channels[0] at this point doesn't matter. We clear it to make state tidy in a debugger but we don't strictly need to.
    // When we switch to the next channel, we'll copy draw_list->_CmdBuffer/_IdxBuffer into Channels[0] and then Channels[1] into draw_list->CmdBuffer/_IdxBuffer
    memset(&_Channels[0], 0, sizeof(ImDrawChannel));
    for (int i = 1; i < channels_count; i++)
    {
        if (i >= old_channels_count)
        {
            IM_PLACEMENT_NEW(&_Channels[i]) ImDrawChannel();
        }
        else
        {
            _Channels[i]._CmdBuffer.resize(0);
            _Channels[i]._IdxBuffer.resize(0);
        }
    }
}